

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_functionBytecodeDirectCompiler_compileASTNodeWithEnvironment
          (sysbvm_context_t *context,sysbvm_functionBytecodeDirectCompiler_t *compiler_,
          sysbvm_tuple_t astNode,sysbvm_tuple_t environment)

{
  undefined8 uVar1;
  sysbvm_tuple_t sVar2;
  undefined1 local_60 [8];
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_24_3_800c08f7 gcFrame;
  sysbvm_tuple_t environment_local;
  sysbvm_tuple_t astNode_local;
  sysbvm_functionBytecodeDirectCompiler_t *compiler__local;
  sysbvm_context_t *context_local;
  
  gcFrameRecord.roots = (sysbvm_tuple_t *)compiler_;
  memset(local_60,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_JIT_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_60);
  uVar1 = *(undefined8 *)(gcFrameRecord.roots[2] + 0x60);
  *(sysbvm_tuple_t *)(gcFrameRecord.roots[2] + 0x60) = environment;
  sVar2 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                    (context,(sysbvm_functionBytecodeDirectCompiler_t *)gcFrameRecord.roots,astNode)
  ;
  *(undefined8 *)(gcFrameRecord.roots[2] + 0x60) = uVar1;
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_60);
  return sVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionBytecodeDirectCompiler_compileASTNodeWithEnvironment(sysbvm_context_t *context, sysbvm_functionBytecodeDirectCompiler_t *compiler_, sysbvm_tuple_t astNode, sysbvm_tuple_t environment)
{
    struct {
        sysbvm_functionBytecodeDirectCompiler_t *compiler;
        sysbvm_tuple_t oldEnvironment;
        sysbvm_tuple_t result;
    } gcFrame = {
        .compiler = compiler_,
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.oldEnvironment = gcFrame.compiler->assembler->sourceEnvironment;
    gcFrame.compiler->assembler->sourceEnvironment = environment;

    gcFrame.result = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, gcFrame.compiler, astNode);

    gcFrame.compiler->assembler->sourceEnvironment = gcFrame.oldEnvironment;

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}